

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::RuleBasedCollator::setReorderCodes
          (RuleBasedCollator *this,int32_t *reorderCodes,int32_t length,UErrorCode *errorCode)

{
  CollationSettings *other;
  int iVar1;
  int32_t iVar2;
  CollationSettings *pCVar3;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if ((length < 0) || (length != 0 && reorderCodes == (int32_t *)0x0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if (length == 1) {
    length = (int32_t)(*reorderCodes != 0x67);
  }
  pCVar3 = this->settings;
  if ((length == pCVar3->reorderCodesLength) &&
     (iVar1 = bcmp(reorderCodes,pCVar3->reorderCodes,(ulong)(uint)(length * 4)), iVar1 == 0)) {
    return;
  }
  if ((length == 1) && (*reorderCodes == -1)) {
    other = this->tailoring->settings;
    if (pCVar3 == other) {
      return;
    }
    pCVar3 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
    if (pCVar3 != (CollationSettings *)0x0) {
      CollationSettings::copyReorderingFrom(pCVar3,other,errorCode);
      iVar2 = CollationFastLatin::getOptions(this->data,pCVar3,pCVar3->fastLatinPrimaries,0x180);
      pCVar3->fastLatinOptions = iVar2;
      return;
    }
  }
  else {
    pCVar3 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
    if (pCVar3 != (CollationSettings *)0x0) {
      CollationSettings::setReordering(pCVar3,this->data,reorderCodes,length,errorCode);
      iVar2 = CollationFastLatin::getOptions(this->data,pCVar3,pCVar3->fastLatinPrimaries,0x180);
      pCVar3->fastLatinOptions = iVar2;
      return;
    }
  }
  *errorCode = U_MEMORY_ALLOCATION_ERROR;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }